

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O3

void Curl_cshutdn_setfds(cshutdn *cshutdn,Curl_easy *data,fd_set *read_fd_set,fd_set *write_fd_set,
                        int *maxfd)

{
  byte bVar1;
  int iVar2;
  Curl_llist_node *pCVar3;
  connectdata *conn;
  ulong uVar4;
  int iVar5;
  easy_pollset ps;
  easy_pollset local_58;
  
  pCVar3 = Curl_llist_head(&cshutdn->list);
  if (pCVar3 != (Curl_llist_node *)0x0) {
    for (pCVar3 = Curl_llist_head(&cshutdn->list); pCVar3 != (Curl_llist_node *)0x0;
        pCVar3 = Curl_node_next(pCVar3)) {
      conn = (connectdata *)Curl_node_elem(pCVar3);
      local_58.sockets[0] = 0;
      local_58.sockets[1] = 0;
      local_58.sockets[2] = 0;
      local_58.sockets[3] = 0;
      local_58.sockets[4] = 0;
      local_58.num = 0;
      local_58.actions[0] = '\0';
      local_58.actions[1] = '\0';
      local_58.actions[2] = '\0';
      local_58.actions[3] = '\0';
      local_58.actions[4] = '\0';
      local_58._29_3_ = 0;
      Curl_attach_connection(data,conn);
      Curl_conn_adjust_pollset(data,conn,&local_58);
      Curl_detach_connection(data);
      if ((ulong)local_58._16_8_ >> 0x20 != 0) {
        uVar4 = 0;
        do {
          bVar1 = local_58.actions[uVar4];
          if ((bVar1 & 1) != 0) {
            iVar2 = local_58.sockets[uVar4];
            iVar5 = iVar2 + 0x3f;
            if (-1 < iVar2) {
              iVar5 = iVar2;
            }
            read_fd_set->fds_bits[iVar5 >> 6] =
                 read_fd_set->fds_bits[iVar5 >> 6] | 1L << ((byte)iVar2 & 0x3f);
          }
          if ((bVar1 & 2) != 0) {
            iVar2 = local_58.sockets[uVar4];
            iVar5 = iVar2 + 0x3f;
            if (-1 < iVar2) {
              iVar5 = iVar2;
            }
            write_fd_set->fds_bits[iVar5 >> 6] =
                 write_fd_set->fds_bits[iVar5 >> 6] | 1L << ((byte)iVar2 & 0x3f);
          }
          if (((bVar1 & 3) != 0) && (*maxfd < local_58.sockets[uVar4])) {
            *maxfd = local_58.sockets[uVar4];
          }
          uVar4 = uVar4 + 1;
        } while ((ulong)local_58._16_8_ >> 0x20 != uVar4);
      }
    }
  }
  return;
}

Assistant:

void Curl_cshutdn_setfds(struct cshutdn *cshutdn,
                         struct Curl_easy *data,
                         fd_set *read_fd_set, fd_set *write_fd_set,
                         int *maxfd)
{
  if(Curl_llist_head(&cshutdn->list)) {
    struct Curl_llist_node *e;

    for(e = Curl_llist_head(&cshutdn->list); e;
        e = Curl_node_next(e)) {
      struct easy_pollset ps;
      unsigned int i;
      struct connectdata *conn = Curl_node_elem(e);
      memset(&ps, 0, sizeof(ps));
      Curl_attach_connection(data, conn);
      Curl_conn_adjust_pollset(data, conn, &ps);
      Curl_detach_connection(data);

      for(i = 0; i < ps.num; i++) {
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
        if(ps.actions[i] & CURL_POLL_IN)
          FD_SET(ps.sockets[i], read_fd_set);
        if(ps.actions[i] & CURL_POLL_OUT)
          FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
        if((ps.actions[i] & (CURL_POLL_OUT | CURL_POLL_IN)) &&
           ((int)ps.sockets[i] > *maxfd))
          *maxfd = (int)ps.sockets[i];
      }
    }
  }
}